

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontstash.h
# Opt level: O0

FONScontext * fonsCreateInternal(FONSparams *params)

{
  int iVar1;
  FONScontext *context;
  uchar *puVar2;
  FONSatlas *pFVar3;
  FONSfont **ppFVar4;
  FONScontext *stash;
  FONSparams *params_local;
  
  context = (FONScontext *)malloc(0x5280);
  if (context != (FONScontext *)0x0) {
    memset(context,0,0x5280);
    memcpy(context,params,0x40);
    puVar2 = (uchar *)malloc(96000);
    context->scratch = puVar2;
    if (((context->scratch != (uchar *)0x0) && (iVar1 = fons__tt_init(context), iVar1 != 0)) &&
       (((context->params).renderCreate == (_func_int_void_ptr_int_int *)0x0 ||
        (iVar1 = (*(context->params).renderCreate)
                           ((context->params).userPtr,(context->params).width,
                            (context->params).height), iVar1 != 0)))) {
      pFVar3 = fons__allocAtlas((context->params).width,(context->params).height,0x100);
      context->atlas = pFVar3;
      if (context->atlas != (FONSatlas *)0x0) {
        ppFVar4 = (FONSfont **)malloc(0x20);
        context->fonts = ppFVar4;
        if (context->fonts != (FONSfont **)0x0) {
          memset(context->fonts,0,0x20);
          context->cfonts = 4;
          context->nfonts = 0;
          context->itw = 1.0 / (float)(context->params).width;
          context->ith = 1.0 / (float)(context->params).height;
          puVar2 = (uchar *)malloc((long)((context->params).width * (context->params).height));
          context->texData = puVar2;
          if (context->texData != (uchar *)0x0) {
            memset(context->texData,0,(long)((context->params).width * (context->params).height));
            context->dirtyRect[0] = (context->params).width;
            context->dirtyRect[1] = (context->params).height;
            context->dirtyRect[2] = 0;
            context->dirtyRect[3] = 0;
            fons__addWhiteRect(context,2,2);
            fonsPushState(context);
            fonsClearState(context);
            return context;
          }
        }
      }
    }
  }
  fonsDeleteInternal(context);
  return (FONScontext *)0x0;
}

Assistant:

FONScontext* fonsCreateInternal(FONSparams* params)
{
	FONScontext* stash = NULL;

	// Allocate memory for the font stash.
	stash = (FONScontext*)malloc(sizeof(FONScontext));
	if (stash == NULL) goto error;
	memset(stash, 0, sizeof(FONScontext));

	stash->params = *params;

	// Allocate scratch buffer.
	stash->scratch = (unsigned char*)malloc(FONS_SCRATCH_BUF_SIZE);
	if (stash->scratch == NULL) goto error;

	// Initialize implementation library
	if (!fons__tt_init(stash)) goto error;

	if (stash->params.renderCreate != NULL) {
		if (stash->params.renderCreate(stash->params.userPtr, stash->params.width, stash->params.height) == 0)
			goto error;
	}

	stash->atlas = fons__allocAtlas(stash->params.width, stash->params.height, FONS_INIT_ATLAS_NODES);
	if (stash->atlas == NULL) goto error;

	// Allocate space for fonts.
	stash->fonts = (FONSfont**)malloc(sizeof(FONSfont*) * FONS_INIT_FONTS);
	if (stash->fonts == NULL) goto error;
	memset(stash->fonts, 0, sizeof(FONSfont*) * FONS_INIT_FONTS);
	stash->cfonts = FONS_INIT_FONTS;
	stash->nfonts = 0;

	// Create texture for the cache.
	stash->itw = 1.0f/stash->params.width;
	stash->ith = 1.0f/stash->params.height;
	stash->texData = (unsigned char*)malloc(stash->params.width * stash->params.height);
	if (stash->texData == NULL) goto error;
	memset(stash->texData, 0, stash->params.width * stash->params.height);

	stash->dirtyRect[0] = stash->params.width;
	stash->dirtyRect[1] = stash->params.height;
	stash->dirtyRect[2] = 0;
	stash->dirtyRect[3] = 0;

	// Add white rect at 0,0 for debug drawing.
	fons__addWhiteRect(stash, 2,2);

	fonsPushState(stash);
	fonsClearState(stash);

	return stash;

error:
	fonsDeleteInternal(stash);
	return NULL;
}